

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpSubscriptionRequest.c
# Opt level: O1

void UpnpSubscriptionRequest_delete(UpnpSubscriptionRequest *q)

{
  s_UpnpSubscriptionRequest *p;
  
  if (q != (UpnpSubscriptionRequest *)0x0) {
    UpnpString_delete(q->m_SID);
    q->m_SID = (UpnpString *)0x0;
    UpnpString_delete(q->m_UDN);
    q->m_UDN = (UpnpString *)0x0;
    UpnpString_delete(q->m_ServiceId);
    q->m_ServiceId = (UpnpString *)0x0;
    free(q);
    return;
  }
  return;
}

Assistant:

void UpnpSubscriptionRequest_delete(UpnpSubscriptionRequest *q)
{
	struct s_UpnpSubscriptionRequest *p =
		(struct s_UpnpSubscriptionRequest *)q;

	if (!p)
		return;

	UpnpString_delete(p->m_SID);
	p->m_SID = 0;
	UpnpString_delete(p->m_UDN);
	p->m_UDN = 0;
	UpnpString_delete(p->m_ServiceId);
	p->m_ServiceId = 0;

	free(p);
}